

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

al_fixed al_fixatan(al_fixed x)

{
  int iVar1;
  bool local_19;
  al_fixed d;
  int c;
  int b;
  int a;
  al_fixed x_local;
  int local_4;
  
  if (x < 0) {
    a = 0x80;
    b = 0xff;
  }
  else {
    a = 0;
    b = 0x7f;
  }
  do {
    local_4 = a + b >> 1;
    iVar1 = x - _al_fix_tan_tbl[local_4];
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        b = local_4 + -1;
      }
    }
    else {
      a = local_4 + 1;
    }
    local_19 = a <= b && x != _al_fix_tan_tbl[local_4];
  } while (local_19);
  if (x < 0) {
    local_4 = local_4 * 0x8000 + -0x800000;
  }
  else {
    local_4 = local_4 << 0xf;
  }
  return local_4;
}

Assistant:

al_fixed al_fixatan(al_fixed x)
{
   int a, b, c;            /* for binary search */
   al_fixed d;                /* difference value for search */

   if (x >= 0) {           /* search the first part of tan table */
      a = 0;
      b = 127;
   }
   else {                  /* search the second half instead */
      a = 128;
      b = 255;
   }

   do {
      c = (a + b) >> 1;
      d = x - _al_fix_tan_tbl[c];

      if (d > 0)
	 a = c + 1;
      else
	 if (d < 0)
	    b = c - 1;

   } while ((a <= b) && (d));

   if (x >= 0)
      return ((long)c) << 15;

   return (-0x00800000L + (((long)c) << 15));
}